

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O2

void __thiscall ktx::PrintDiff::operator<<(PrintDiff *this,DiffImage *diff)

{
  pointer ppVar1;
  OutputFormat OVar2;
  PrintDiff *pPVar3;
  bool bVar4;
  TexelBlockPtr<unsigned_char_*> *pTVar5;
  int depth;
  PrintIndent *pPVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  uvec4 uVar7;
  string_view fmt;
  anon_class_1_0_00000001 formatOptionalFileOffset;
  char *space;
  string *local_1b8;
  PrintDiff *local_1b0;
  pointer local_1a8;
  pointer local_1a0;
  uvec4 pixelCoords;
  ptrdiff_t imageByteOffset_1;
  DiffImage *local_168;
  ptrdiff_t imageByteOffset;
  string comma;
  anon_class_8_1_a8a2e026 formatChannels;
  anon_class_8_1_a8a2e026 formatPacked;
  char *nl;
  optional<unsigned_long> *local_120;
  optional<unsigned_long> *local_118;
  anon_class_8_1_8991fb9c printDiff;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  __string_type local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  __string_type local_50;
  
  this->different = true;
  OVar2 = this->outputFormat;
  space = " ";
  if (OVar2 == json_mini) {
    space = "";
  }
  nl = "\n";
  if (OVar2 == json_mini) {
    nl = "";
  }
  local_1b0 = this;
  formatChannels.space = space;
  formatPacked.space = space;
  if (OVar2 == text) {
    printContext(this);
    PrintIndent::operator()(this->printIndent,0,(char (*) [5])"+{}\n",&diff->textHeader);
    local_1a8 = (diff->texelBlockPairList->
                super__Vector_base<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    local_1a0 = (pointer)diff->fileOffsets;
    local_168 = (DiffImage *)(diff->fileOffsets + 1);
    local_1b8 = &local_90;
    for (pTVar5 = &((diff->texelBlockPairList->
                    super__Vector_base<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start)->second;
        ppVar1 = (pointer)(pTVar5 + -1), ppVar1 != local_1a8; pTVar5 = pTVar5 + 2) {
      comma._0_16_ = ImageSpan::TexelBlockPtr<unsigned_char_*>::getPixelLocation
                               ((TexelBlockPtr<unsigned_char_*> *)ppVar1);
      uVar7 = ImageSpan::TexelBlockPtr<unsigned_char_*>::getPixelLocation(pTVar5);
      pPVar3 = local_1b0;
      if (((((int)comma._M_dataplus._M_p != uVar7.field_0._0_4_) ||
           (comma._M_dataplus._M_p._4_4_ != uVar7.field_0._4_4_)) ||
          ((int)comma._M_string_length != uVar7.field_0._8_4_)) ||
         (comma._M_string_length._4_4_ != uVar7.field_0._12_4_)) {
        __assert_fail("pixelCoords == texelBlockPair.second.getPixelLocation()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp"
                      ,0x2d6,"void ktx::PrintDiff::operator<<(const DiffImage &)");
      }
      PrintIndent::operator()
                (local_1b0->printIndent,0,(char (*) [27])"  Coordinates: {}, {}, {}\n",
                 (uint *)&comma,(uint *)((long)&comma._M_dataplus._M_p + 4),
                 (uint *)&comma._M_string_length);
      imageByteOffset_1 = (long)pTVar5[-1].ptr - (long)(pTVar5[-1].span)->pixels;
      if (imageByteOffset_1 != (long)pTVar5->ptr - (long)pTVar5->span->pixels) {
        __assert_fail("imageByteOffset == texelBlockPair.second.getTexelBlockByteOffset()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp"
                      ,0x2db,"void ktx::PrintDiff::operator<<(const DiffImage &)");
      }
      PrintIndent::operator()
                (pPVar3->printIndent,0,(char (*) [31])"    Image byte offset: 0x{:x}\n",
                 &imageByteOffset_1);
      printDiff.this = pPVar3;
      TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
      {lambda(std::optional<unsigned_long>const&,unsigned_long,bool)#1}::operator<<
                (&local_90,&formatOptionalFileOffset,(optional<unsigned_long> *)local_1a0,
                 imageByteOffset_1,false);
      TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
      {lambda(std::optional<unsigned_long>const&,unsigned_long,bool)#1}::operator<<
                (&local_b0,&formatOptionalFileOffset,(optional<unsigned_long> *)local_168,
                 imageByteOffset_1,false);
      operator<<::anon_class_8_1_8991fb9c::operator()
                (&printDiff,"File byte offset",&local_90,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
      {lambda(ImageSpan::TexelBlockPtr<unsigned_char*>const&,bool)#1}::operator<<
                (&local_50,&formatPacked,(TexelBlockPtr<unsigned_char_*> *)ppVar1,false);
      TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
      {lambda(ImageSpan::TexelBlockPtr<unsigned_char*>const&,bool)#1}::operator<<
                (&local_d0,&formatPacked,pTVar5,false);
      operator<<::anon_class_8_1_8991fb9c::operator()(&printDiff,"Packed",&local_50,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_50);
      if (((uint)(pTVar5[-1].span)->codec->flags & 2) == 0) {
        TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
        {lambda(ImageSpan::TexelBlockPtr<unsigned_char*>const&,bool)#2}::operator<<
                  (&local_70,&formatChannels,(TexelBlockPtr<unsigned_char_*> *)ppVar1,false);
        TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
        {lambda(ImageSpan::TexelBlockPtr<unsigned_char*>const&,bool)#2}::operator<<
                  (&local_f0,&formatChannels,pTVar5,false);
        operator<<::anon_class_8_1_8991fb9c::operator()(&printDiff,"Channels",&local_70,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
  }
  else {
    beginJsonOutput(this);
    PrintIndent::operator()
              (this->printIndent,2,(char (*) [9])"\"{}\":{}[",&diff->fragmentUri,&space);
    local_1b8 = (string *)
                (diff->texelBlockPairList->
                super__Vector_base<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    local_118 = diff->fileOffsets;
    local_120 = diff->fileOffsets + 1;
    pTVar5 = &((diff->texelBlockPairList->
               super__Vector_base<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->second;
    bVar4 = true;
    local_168 = diff;
    while( true ) {
      args.desc_ = (allocator<char> *)&imageByteOffset_1;
      ppVar1 = (pointer)(pTVar5 + -1);
      if ((string *)ppVar1 == local_1b8) break;
      if (bVar4) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&comma,"",args.desc_);
      }
      else {
        imageByteOffset_1 = (ptrdiff_t)space;
        args.field_1.args_ = in_R9.args_;
        fmt.size_ = 0xc;
        fmt.data_ = (char *)0x3;
        ::fmt::v10::vformat_abi_cxx11_(&comma,(v10 *)0x1cdd3e,fmt,args);
      }
      PrintIndent::operator()(this->printIndent,0,(char (*) [5])0x1e185e,&comma,&nl);
      PrintIndent::operator()(this->printIndent,3,(char (*) [5])0x1cef39,&nl);
      pixelCoords = ImageSpan::TexelBlockPtr<unsigned_char_*>::getPixelLocation
                              ((TexelBlockPtr<unsigned_char_*> *)ppVar1);
      uVar7 = ImageSpan::TexelBlockPtr<unsigned_char_*>::getPixelLocation(pTVar5);
      if (((pixelCoords.field_0.field_0.x != uVar7.field_0._0_4_) ||
          (pixelCoords.field_0.field_0.y != uVar7.field_0._4_4_)) ||
         ((pixelCoords.field_0.field_0.z != uVar7.field_0._8_4_ ||
          (pixelCoords.field_0.field_0.w != uVar7.field_0._12_4_)))) {
        __assert_fail("pixelCoords == texelBlockPair.second.getPixelLocation()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp"
                      ,0x2fc,"void ktx::PrintDiff::operator<<(const DiffImage &)");
      }
      PrintIndent::operator()
                (this->printIndent,4,(char (*) [38])"\"coordinates\":{}[{}{},{}{},{}{}{}],{}",&space
                 ,&space,(uint *)&pixelCoords,&space,&pixelCoords.field_0.field_0.y,&space,
                 &pixelCoords.field_0.field_0.z,&space,&nl);
      pPVar3 = local_1b0;
      imageByteOffset = (long)pTVar5[-1].ptr - (long)(pTVar5[-1].span)->pixels;
      local_1a8 = (pointer)pTVar5;
      local_1a0 = ppVar1;
      if (imageByteOffset != (long)pTVar5->ptr - (long)pTVar5->span->pixels) {
        __assert_fail("imageByteOffset == texelBlockPair.second.getTexelBlockByteOffset()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp"
                      ,0x302,"void ktx::PrintDiff::operator<<(const DiffImage &)");
      }
      PrintIndent::operator()
                (local_1b0->printIndent,4,(char (*) [37])"\"imageByteOffset\":{}[{}{},{}{}{}],{}",
                 &space,&space,&imageByteOffset,&space,&imageByteOffset,&space,&nl);
      pPVar6 = pPVar3->printIndent;
      TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
      {lambda(std::optional<unsigned_long>const&,unsigned_long,bool)#1}::operator<<
                ((string *)&imageByteOffset_1,&formatOptionalFileOffset,local_118,imageByteOffset,
                 true);
      TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
      {lambda(std::optional<unsigned_long>const&,unsigned_long,bool)#1}::operator<<
                ((string *)&printDiff,&formatOptionalFileOffset,local_120,imageByteOffset,true);
      PrintIndent::operator()
                (pPVar6,4,(char (*) [36])"\"fileByteOffset\":{}[{}{},{}{}{}],{}",&space,&space,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &imageByteOffset_1,&space,(string *)&printDiff,&space,&nl);
      std::__cxx11::string::~string((string *)&printDiff);
      std::__cxx11::string::~string((string *)&imageByteOffset_1);
      pPVar3 = local_1b0;
      PrintIndent::operator()(local_1b0->printIndent,4,(char (*) [15])"\"packed\":{}[{}",&space,&nl)
      ;
      pPVar6 = pPVar3->printIndent;
      TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
      {lambda(ImageSpan::TexelBlockPtr<unsigned_char*>const&,bool)#1}::operator<<
                ((__string_type *)&imageByteOffset_1,&formatPacked,&local_1a0->first,true);
      PrintIndent::operator()
                (pPVar6,5,(char (*) [12])"[{}{}{}],{}",&space,(__string_type *)&imageByteOffset_1,
                 &space,&nl);
      std::__cxx11::string::~string((string *)&imageByteOffset_1);
      pPVar6 = local_1b0->printIndent;
      TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
      {lambda(ImageSpan::TexelBlockPtr<unsigned_char*>const&,bool)#1}::operator<<
                ((__string_type *)&imageByteOffset_1,&formatPacked,&local_1a8->first,true);
      in_R9.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&space;
      PrintIndent::operator()
                (pPVar6,5,(char (*) [11])"[{}{}{}]{}",(char **)in_R9.values_,
                 (__string_type *)&imageByteOffset_1,(char **)in_R9,&nl);
      std::__cxx11::string::~string((string *)&imageByteOffset_1);
      this = local_1b0;
      PrintIndent::operator()(local_1b0->printIndent,4,(char (*) [2])0x1d9cf4);
      if (((uint)((TexelBlockPtr<unsigned_char_*> *)((long)local_1a8 + -0x10))->span->codec->flags &
          2) == 0) {
        PrintIndent::operator()(this->printIndent,0,(char (*) [4])0x1cdd3e,&nl);
        PrintIndent::operator()(this->printIndent,4,(char (*) [17])"\"channels\":{}[{}",&space,&nl);
        pPVar6 = this->printIndent;
        TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
        {lambda(ImageSpan::TexelBlockPtr<unsigned_char*>const&,bool)#2}::operator<<
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &imageByteOffset_1,&formatChannels,&local_1a0->first,true);
        PrintIndent::operator()
                  (pPVar6,5,(char (*) [12])"[{}{}{}],{}",&space,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &imageByteOffset_1,&space,&nl);
        std::__cxx11::string::~string((string *)&imageByteOffset_1);
        pPVar6 = local_1b0->printIndent;
        TEMPNAMEPLACEHOLDERVALUE(ktx::DiffImage_const&)::
        {lambda(ImageSpan::TexelBlockPtr<unsigned_char*>const&,bool)#2}::operator<<
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &imageByteOffset_1,&formatChannels,&local_1a8->first,true);
        in_R9.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&space;
        PrintIndent::operator()
                  (pPVar6,5,(char (*) [11])"[{}{}{}]{}",(char **)in_R9.values_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &imageByteOffset_1,(char **)in_R9,&nl);
        std::__cxx11::string::~string((string *)&imageByteOffset_1);
        this = local_1b0;
        PrintIndent::operator()(local_1b0->printIndent,4,(char (*) [2])0x1d9cf4);
      }
      PrintIndent::operator()(this->printIndent,0,(char (*) [3])0x1dcb84,&nl);
      PrintIndent::operator()(this->printIndent,3,(char (*) [3])0x1d0ec9);
      std::__cxx11::string::~string((string *)&comma);
      pTVar5 = (TexelBlockPtr<unsigned_char_*> *)((long)local_1a8 + 0x20);
      bVar4 = false;
    }
    pPVar6 = this->printIndent;
    if ((local_168->texelBlockPairList->
        super__Vector_base<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        (local_168->texelBlockPairList->
        super__Vector_base<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>,_std::allocator<std::pair<ImageSpan::TexelBlockPtr<unsigned_char_*>,_ImageSpan::TexelBlockPtr<unsigned_char_*>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      depth = 0;
    }
    else {
      PrintIndent::operator()(pPVar6,0,(char (*) [3])0x1dcb84,&nl);
      pPVar6 = this->printIndent;
      depth = 2;
    }
    PrintIndent::operator()(pPVar6,depth,(char (*) [2])0x1d9cf4);
  }
  return;
}

Assistant:

void operator<<(const DiffImage& diff) {
        different = true;

        const auto space = outputFormat != OutputFormat::json_mini ?  " " : "";
        const auto nl = outputFormat != OutputFormat::json_mini ?  "\n" : "";

        auto formatOptionalFileOffset = [](const std::optional<std::size_t>& fileOffset, std::size_t imageOffset, bool json) {
            if (fileOffset.has_value())
                return fmt::format(json ? "{}" : "0x{:x}", *fileOffset + imageOffset);
            else
                return fmt::format(json ? "null" : "N/A");
        };

        auto formatPacked = [=](const ImageSpan::TexelBlockPtr<>& texelBlock, bool json) {
            const uint32_t hexDigits = texelBlock.getPackedElementByteSize() << 1;
            const auto quote = json ? "\"" : "";
            std::stringstream formattedValue;
            bool first = true;
            for (uint32_t elementIdx = 0; elementIdx < texelBlock.getPackedElementCount(); ++elementIdx) {
                const uint32_t element = texelBlock.getPackedElement(elementIdx);
                const auto comma = std::exchange(first, false) ? "" : fmt::format(",{}", space);
                fmt::print(formattedValue, "{}{}0x{:0{}x}{}", comma, quote, element, hexDigits, quote);
            }
            return formattedValue.str();
        };

        auto formatChannels = [=](const ImageSpan::TexelBlockPtr<>& texelBlock, bool json) {
            // If decodable channels are not available (e.g. block compressed), then this should not be called
            assert(texelBlock.getChannelCount() != 0);
            const auto quote = json ? "\"" : "";
            std::stringstream formattedValue;
            bool first = true;
            // Prefer to decode to integer (e.g. UNORM will be output as list of integer values instead of float values)
            if (texelBlock.canDecodeUINT()) {
                // Unsigned integer channels
                const glm::uvec4 channels = texelBlock.decodeUINT();
                for (uint32_t channelIdx = 0; channelIdx < texelBlock.getChannelCount(); ++channelIdx) {
                    const auto comma = std::exchange(first, false) ? "" : fmt::format(",{}", space);
                    fmt::print(formattedValue, "{}{}", comma, channels[channelIdx]);
                }
            } else if (texelBlock.canDecodeSINT()) {
                // Signed integer channels
                const glm::ivec4 channels = texelBlock.decodeSINT();
                for (uint32_t channelIdx = 0; channelIdx < texelBlock.getChannelCount(); ++channelIdx) {
                    const auto comma = std::exchange(first, false) ? "" : fmt::format(",{}", space);
                    fmt::print(formattedValue, "{}{}", comma, channels[channelIdx]);
                }
            } else if (texelBlock.canDecodeFLOAT()) {
                // Floating point channels
                const glm::vec4 channels = texelBlock.decodeFLOAT();
                for (uint32_t channelIdx = 0; channelIdx < texelBlock.getChannelCount(); ++channelIdx) {
                    const auto comma = std::exchange(first, false) ? "" : fmt::format(",{}", space);
                    float channel = channels[channelIdx];
                    if (std::isinf(channel)) {
                        // Output signed infinity (optionally quoted)
                        const auto sign = std::signbit(channel) ? "-" : "+";
                        fmt::print(formattedValue, "{}{}{}inf{}", comma, quote, sign, quote);
                    } else if (std::isnan(channel)) {
                        // Output signed not-a-number (optionally quoted)
                        fmt::print(formattedValue, "{}{}nan{}", comma, quote, quote);
                    } else {
                        // Output signed value (explicitly handle sign bit to differentiate between +0.0 and -0.0)
                        // However, we only output sign for negative values because JSON does not allow leading "+"
                        const auto sign = std::signbit(channel) ? "-" : "";
                        fmt::print(formattedValue, "{}{}{}", comma, sign, std::abs(channel));
                    }
                }
            } else {
                // Unexpected format
                assert(false);
                return std::string("");
            }
            return formattedValue.str();
        };

        if (outputFormat == OutputFormat::text) {
            printContext();
            printIndent(0, "+{}\n", diff.textHeader);
            for (const auto& texelBlockPair : diff.texelBlockPairList) {
                const auto pixelCoords = texelBlockPair.first.getPixelLocation();
                // Currently we only compare texel blocks with the same coordinates
                assert(pixelCoords == texelBlockPair.second.getPixelLocation());
                printIndent(0, "  Coordinates: {}, {}, {}\n", pixelCoords.x, pixelCoords.y, pixelCoords.z);

                const auto imageByteOffset = texelBlockPair.first.getTexelBlockByteOffset();
                // Currently we only compare matching formats, hence image byte offsets should match
                assert(imageByteOffset == texelBlockPair.second.getTexelBlockByteOffset());
                printIndent(0, "    Image byte offset: 0x{:x}\n", imageByteOffset);

                auto printDiff = [=](const char* textHeader, const std::string firstValue, const std::string secondValue) {
                    if (firstValue == secondValue) {
                        printIndent(0, "    {}: {}\n", textHeader, firstValue);
                    } else {
                        printIndent(0, "-    {}: {}\n", textHeader, firstValue);
                        printIndent(0, "+    {}: {}\n", textHeader, secondValue);
                    }
                };

                printDiff("File byte offset",
                    formatOptionalFileOffset(diff.fileOffsets[0], imageByteOffset, false),
                    formatOptionalFileOffset(diff.fileOffsets[1], imageByteOffset, false));

                printDiff("Packed", formatPacked(texelBlockPair.first, false), formatPacked(texelBlockPair.second, false));

                // Only output chnalles if not block-compressed
                if (!texelBlockPair.first.isBlockCompressed())
                    printDiff("Channels", formatChannels(texelBlockPair.first, false), formatChannels(texelBlockPair.second, false));
            }
        } else {
            beginJsonOutput();
            printIndent(2, "\"{}\":{}[", diff.fragmentUri, space);
            bool first = true;
            for (const auto& texelBlockPair : diff.texelBlockPairList) {
                const auto comma = std::exchange(first, false) ? "" : fmt::format(",{}", space);
                printIndent(0, "{}{}", comma, nl);
                printIndent(3, "{{{}", nl);

                const auto pixelCoords = texelBlockPair.first.getPixelLocation();
                // Currently we only compare texel blocks with the same coordinates
                assert(pixelCoords == texelBlockPair.second.getPixelLocation());
                printIndent(4, "\"coordinates\":{}[{}{},{}{},{}{}{}],{}", space, space,
                    pixelCoords.x, space, pixelCoords.y, space, pixelCoords.z, space, nl);

                const auto imageByteOffset = texelBlockPair.first.getTexelBlockByteOffset();
                // Currently we only compare matching formats, hence image byte offsets should match
                assert(imageByteOffset == texelBlockPair.second.getTexelBlockByteOffset());
                printIndent(4, "\"imageByteOffset\":{}[{}{},{}{}{}],{}", space, space,
                    imageByteOffset, space, imageByteOffset, space, nl);

                printIndent(4, "\"fileByteOffset\":{}[{}{},{}{}{}],{}", space, space,
                    formatOptionalFileOffset(diff.fileOffsets[0], imageByteOffset, true), space,
                    formatOptionalFileOffset(diff.fileOffsets[1], imageByteOffset, true), space, nl);

                printIndent(4, "\"packed\":{}[{}", space, nl);
                printIndent(5, "[{}{}{}],{}", space, formatPacked(texelBlockPair.first, true), space, nl);
                printIndent(5, "[{}{}{}]{}", space, formatPacked(texelBlockPair.second, true), space, nl);
                printIndent(4, "]");

                // Only output channels if not block-compressed
                if (!texelBlockPair.first.isBlockCompressed()) {
                    printIndent(0, ",{}", nl);
                    printIndent(4, "\"channels\":{}[{}", space, nl);
                    printIndent(5, "[{}{}{}],{}", space, formatChannels(texelBlockPair.first, true), space, nl);
                    printIndent(5, "[{}{}{}]{}", space, formatChannels(texelBlockPair.second, true), space, nl);
                    printIndent(4, "]");
                }

                printIndent(0, "{}", nl);
                printIndent(3, "}}");
            }
            if (diff.texelBlockPairList.empty()) {
                printIndent(0, "]");
            } else {
                printIndent(0, "{}", nl);
                printIndent(2, "]");
            }
        }
    }